

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_3::detail::concat<std::__cxx11::string,char_const(&)[56],char_const*>
          (char (*args) [56],char **args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char (*in_stack_ffffffffffffffb8) [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  
  out = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  concat_length<char_const*>((char *)out,(char **)in_stack_ffffffffffffffb8);
  std::__cxx11::string::reserve((ulong)in_RDI);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[56],_const_char_*,_0>
            (out,in_stack_ffffffffffffffb8,(char **)0x2c1f9c);
  return out;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}